

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::load(Args *this,istream *in)

{
  char *in_RSI;
  long in_RDI;
  
  std::istream::read(in_RSI,in_RDI + 0x4c);
  std::istream::read(in_RSI,in_RDI + 0x50);
  std::istream::read(in_RSI,in_RDI + 0x54);
  std::istream::read(in_RSI,in_RDI + 0x58);
  std::istream::read(in_RSI,in_RDI + 0x60);
  std::istream::read(in_RSI,in_RDI + 100);
  std::istream::read(in_RSI,in_RDI + 0x68);
  std::istream::read(in_RSI,in_RDI + 0x6c);
  std::istream::read(in_RSI,in_RDI + 0x70);
  std::istream::read(in_RSI,in_RDI + 0x74);
  std::istream::read(in_RSI,in_RDI + 0x78);
  std::istream::read(in_RSI,in_RDI + 0x48);
  std::istream::read(in_RSI,in_RDI + 0x80);
  return;
}

Assistant:

void Args::load(std::istream& in) {
  in.read((char*)&(dim), sizeof(int));
  in.read((char*)&(ws), sizeof(int));
  in.read((char*)&(epoch), sizeof(int));
  in.read((char*)&(minCount), sizeof(int));
  in.read((char*)&(neg), sizeof(int));
  in.read((char*)&(wordNgrams), sizeof(int));
  in.read((char*)&(loss), sizeof(loss_name));
  in.read((char*)&(model), sizeof(model_name));
  in.read((char*)&(bucket), sizeof(int));
  in.read((char*)&(minn), sizeof(int));
  in.read((char*)&(maxn), sizeof(int));
  in.read((char*)&(lrUpdateRate), sizeof(int));
  in.read((char*)&(t), sizeof(double));
}